

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

int opus_tags_parse_impl(OpusTags *_tags,uchar *_data,size_t _len)

{
  opus_uint32 oVar1;
  opus_uint32 oVar2;
  uchar *_s;
  char *pcVar3;
  int local_40;
  int ret;
  int ci;
  int ncomments;
  size_t len;
  opus_uint32 count;
  size_t _len_local;
  uchar *_data_local;
  OpusTags *_tags_local;
  
  if (_len < 8) {
    _tags_local._4_4_ = -0x84;
  }
  else if (*(long *)_data == 0x736761547375704f) {
    if (_len < 0x10) {
      _tags_local._4_4_ = -0x85;
    }
    else {
      oVar1 = op_parse_uint32le(_data + 8);
      _s = _data + 0xc;
      if (_len - 0xc < (ulong)oVar1) {
        _tags_local._4_4_ = -0x85;
      }
      else {
        if (_tags != (OpusTags *)0x0) {
          pcVar3 = op_strdup_with_len((char *)_s,(ulong)oVar1);
          _tags->vendor = pcVar3;
          if (_tags->vendor == (char *)0x0) {
            return -0x81;
          }
        }
        _ci = (_len - 0xc) - (ulong)oVar1;
        if (_ci < 4) {
          _tags_local._4_4_ = -0x85;
        }
        else {
          oVar2 = op_parse_uint32le(_s + oVar1);
          _len_local = (size_t)(_s + oVar1 + 4);
          _ci = _ci - 4;
          if (_ci >> 2 < (ulong)oVar2) {
            _tags_local._4_4_ = -0x85;
          }
          else if (oVar2 < 0x7fffffff) {
            if ((_tags == (OpusTags *)0x0) ||
               (_tags_local._4_4_ = op_tags_ensure_capacity(_tags,(ulong)oVar2),
               -1 < _tags_local._4_4_)) {
              for (local_40 = 0; local_40 < (int)oVar2; local_40 = local_40 + 1) {
                if (_ci >> 2 < (ulong)(long)(int)(oVar2 - local_40)) {
                  return -0x85;
                }
                oVar1 = op_parse_uint32le((uchar *)_len_local);
                if (_ci - 4 < (ulong)oVar1) {
                  return -0x85;
                }
                if (0x7fffffff < oVar1) {
                  return -0x81;
                }
                if (_tags != (OpusTags *)0x0) {
                  pcVar3 = op_strdup_with_len((char *)(_len_local + 4),(ulong)oVar1);
                  _tags->user_comments[local_40] = pcVar3;
                  if (_tags->user_comments[local_40] == (char *)0x0) {
                    return -0x81;
                  }
                  _tags->comment_lengths[local_40] = oVar1;
                  _tags->comments = local_40 + 1;
                  _tags->user_comments[local_40 + 1] = (char *)0x0;
                }
                _len_local = (size_t)((char *)(_len_local + 4) + oVar1);
                _ci = (_ci - 4) - (ulong)oVar1;
              }
              if ((_ci != 0) && ((*(byte *)_len_local & 1) != 0)) {
                if (0x7fffffff < _ci) {
                  return -0x81;
                }
                if (_tags != (OpusTags *)0x0) {
                  pcVar3 = (char *)malloc(_ci);
                  _tags->user_comments[(int)oVar2] = pcVar3;
                  if (_tags->user_comments[(int)oVar2] == (char *)0x0) {
                    return -0x81;
                  }
                  memcpy(_tags->user_comments[(int)oVar2],(void *)_len_local,_ci);
                  _tags->comment_lengths[(int)oVar2] = (int)_ci;
                }
              }
              _tags_local._4_4_ = 0;
            }
          }
          else {
            _tags_local._4_4_ = -0x81;
          }
        }
      }
    }
  }
  else {
    _tags_local._4_4_ = -0x84;
  }
  return _tags_local._4_4_;
}

Assistant:

static int opus_tags_parse_impl(OpusTags *_tags,
 const unsigned char *_data,size_t _len){
  opus_uint32 count;
  size_t      len;
  int         ncomments;
  int         ci;
  len=_len;
  if(len<8)return OP_ENOTFORMAT;
  if(memcmp(_data,"OpusTags",8)!=0)return OP_ENOTFORMAT;
  if(len<16)return OP_EBADHEADER;
  _data+=8;
  len-=8;
  count=op_parse_uint32le(_data);
  _data+=4;
  len-=4;
  if(count>len)return OP_EBADHEADER;
  if(_tags!=NULL){
    _tags->vendor=op_strdup_with_len((char *)_data,count);
    if(_tags->vendor==NULL)return OP_EFAULT;
  }
  _data+=count;
  len-=count;
  if(len<4)return OP_EBADHEADER;
  count=op_parse_uint32le(_data);
  _data+=4;
  len-=4;
  /*Check to make sure there's minimally sufficient data left in the packet.*/
  if(count>len>>2)return OP_EBADHEADER;
  /*Check for overflow (the API limits this to an int).*/
  if(count>(opus_uint32)INT_MAX-1)return OP_EFAULT;
  if(_tags!=NULL){
    int ret;
    ret=op_tags_ensure_capacity(_tags,count);
    if(ret<0)return ret;
  }
  ncomments=(int)count;
  for(ci=0;ci<ncomments;ci++){
    /*Check to make sure there's minimally sufficient data left in the packet.*/
    if((size_t)(ncomments-ci)>len>>2)return OP_EBADHEADER;
    count=op_parse_uint32le(_data);
    _data+=4;
    len-=4;
    if(count>len)return OP_EBADHEADER;
    /*Check for overflow (the API limits this to an int).*/
    if(count>(opus_uint32)INT_MAX)return OP_EFAULT;
    if(_tags!=NULL){
      _tags->user_comments[ci]=op_strdup_with_len((char *)_data,count);
      if(_tags->user_comments[ci]==NULL)return OP_EFAULT;
      _tags->comment_lengths[ci]=(int)count;
      _tags->comments=ci+1;
      /*Needed by opus_tags_clear() if we fail before parsing the (optional)
         binary metadata.*/
      _tags->user_comments[ci+1]=NULL;
    }
    _data+=count;
    len-=count;
  }
  if(len>0&&(_data[0]&1)){
    if(len>(opus_uint32)INT_MAX)return OP_EFAULT;
    if(_tags!=NULL){
      _tags->user_comments[ncomments]=(char *)_ogg_malloc(len);
      if(OP_UNLIKELY(_tags->user_comments[ncomments]==NULL))return OP_EFAULT;
      memcpy(_tags->user_comments[ncomments],_data,len);
      _tags->comment_lengths[ncomments]=(int)len;
    }
  }
  return 0;
}